

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status fdb_del(fdb_kvs_handle *handle,fdb_doc *doc)

{
  ulong *in_RSI;
  fdb_kvs_handle *in_RDI;
  fdb_doc _doc;
  undefined8 in_stack_ffffffffffffff88;
  memory_order order;
  atomic<unsigned_long> *in_stack_ffffffffffffff90;
  fdb_doc local_68;
  fdb_kvs_handle *local_10;
  fdb_status local_4;
  
  order = (memory_order)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_RDI == (fdb_kvs_handle *)0x0) {
    local_4 = FDB_RESULT_INVALID_HANDLE;
  }
  else if (in_RSI == (ulong *)0x0) {
    local_4 = FDB_RESULT_INVALID_ARGS;
  }
  else if (((in_RDI->config).flags & 2) == 0) {
    if ((((in_RSI[4] == 0) || (*in_RSI == 0)) || (0xff80 < *in_RSI)) ||
       (((in_RDI->kvs_config).custom_cmp != (fdb_custom_cmp_variable)0x0 &&
        ((ulong)((in_RDI->config).blocksize - 0x100) < *in_RSI)))) {
      local_4 = FDB_RESULT_INVALID_ARGS;
    }
    else {
      *(undefined1 *)(in_RSI + 9) = 1;
      local_10 = in_RDI;
      memcpy(&local_68,in_RSI,0x50);
      local_68.bodylen = 0;
      local_68.body = (void *)0x0;
      atomic_incr_uint64_t(in_stack_ffffffffffffff90,order);
      local_4 = fdb_set(local_10,&local_68);
    }
  }
  else {
    local_4 = fdb_log_impl(&in_RDI->log_callback,3,FDB_RESULT_RONLY_VIOLATION,
                           "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/forestdb.cc"
                           ,"fdb_del",0x1134,
                           "Warning: DEL is not allowed on the read-only DB file \'%s\'.",
                           in_RDI->file->filename);
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_del(fdb_kvs_handle *handle, fdb_doc *doc)
{
    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!doc) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if (handle->config.flags & FDB_OPEN_FLAG_RDONLY) {
        return fdb_log(&handle->log_callback, FDB_LOG_WARNING,
                       FDB_RESULT_RONLY_VIOLATION,
                       "Warning: DEL is not allowed on the read-only DB file '%s'.",
                       handle->file->filename);
    }

    if (doc->key == NULL || doc->keylen == 0 ||
        doc->keylen > FDB_MAX_KEYLEN ||
        (handle->kvs_config.custom_cmp &&
            doc->keylen > handle->config.blocksize - HBTRIE_HEADROOM)) {
        return FDB_RESULT_INVALID_ARGS;
    }

    doc->deleted = true;
    fdb_doc _doc;
    _doc = *doc;
    _doc.bodylen = 0;
    _doc.body = NULL;

    atomic_incr_uint64_t(&handle->op_stats->num_dels, std::memory_order_relaxed);

    return fdb_set(handle, &_doc);
}